

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

bool __thiscall TestCase::Start(TestCase *this)

{
  bool bVar1;
  undefined8 uVar2;
  TestCase *this_local;
  
  bVar1 = std::operator==(&this->mTestName,"");
  if (bVar1) {
    printf("Bad Test Case, please call SetTestName in TestCase\'s constructor\n");
    this_local._7_1_ = false;
  }
  else {
    uVar2 = std::__cxx11::string::c_str();
    printf("Running test %s:",uVar2);
    fflush(_stdout);
    JHThread::Thread::Start();
    JHThread::Thread::Join();
    if ((this->mTestComplete & 1U) == 0) {
      printf(" FAILED\nBad Test Case, must call TestPassed or TestFailed before returning\n");
      this_local._7_1_ = false;
    }
    else {
      if ((this->mTestPassed & 1U) == 0) {
        uVar2 = std::__cxx11::string::c_str();
        printf(" FAILED at %s:%d\n",uVar2,(ulong)(uint)this->mLineNumber);
        uVar2 = std::__cxx11::string::c_str();
        printf("%s\n",uVar2);
      }
      else {
        printf(" PASSED\n");
      }
      this_local._7_1_ = (bool)(this->mTestPassed & 1);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Start() 
	{
		if ( mTestName == "" )
		{
			printf( "Bad Test Case, please call SetTestName in TestCase's constructor\n" );
			return false;
		}

		printf( "Running test %s:", mTestName.c_str() );
		fflush( stdout );
		
		// start thread to run test.
		mThread.Start();
		// wait for test to complete.
		mThread.Join();

		// ensure that it completed.		
		if ( not mTestComplete )
		{
			printf( " FAILED\nBad Test Case, must call TestPassed or TestFailed before returning\n" );
			return false;
		}

		if ( mTestPassed )
			printf( " PASSED\n" );
		else
		{
			printf( " FAILED at %s:%d\n", mFilename.c_str(), mLineNumber );
			printf( "%s\n", mErrorString.c_str() );
		}
		// return test status.
		return mTestPassed;
	}